

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void mbc1_write_rom_shared
               (Emulator *e,u16 bank_lo_mask,int bank_hi_shift,MaskedAddress addr,u8 value)

{
  ushort uVar1;
  anon_union_40_5_5d684a24_for_MemoryMapState_3 *paVar2;
  u8 local_2f;
  u16 local_2e;
  ushort local_2c;
  u8 ext_ram_bank;
  u16 rom0_bank;
  u16 rom1_bank;
  u16 hi_bank;
  Mbc1 *mbc1;
  u8 value_local;
  MaskedAddress addr_local;
  int bank_hi_shift_local;
  u16 bank_lo_mask_local;
  Emulator *e_local;
  
  paVar2 = &(e->state).memory_map_state.field_3;
  switch(addr >> 0xd) {
  case 0:
    (e->state).memory_map_state.ext_ram_enabled = (uint)((value & 0xf) == 10);
    break;
  case 1:
    (paVar2->mbc1).byte_2000_3fff = value & 0x1f;
    break;
  case 2:
    (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff = value & 3;
    break;
  case 3:
    (e->state).memory_map_state.field_3.mbc1.bank_mode = value & BANK_MODE_RAM;
  }
  uVar1 = (ushort)(e->state).memory_map_state.field_3.mbc1.byte_4000_5fff <<
          ((byte)bank_hi_shift & 0x1f);
  local_2c = (ushort)(paVar2->mbc1).byte_2000_3fff;
  if (local_2c == 0) {
    local_2c = 1;
  }
  local_2e = 0;
  local_2f = '\0';
  if ((e->state).memory_map_state.field_3.mbc1.bank_mode == BANK_MODE_RAM) {
    local_2f = (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff;
    local_2e = uVar1;
  }
  set_rom_bank(e,0,local_2e);
  set_rom_bank(e,1,local_2c & bank_lo_mask | uVar1);
  set_ext_ram_bank(e,local_2f);
  return;
}

Assistant:

static void mbc1_write_rom_shared(Emulator* e, u16 bank_lo_mask,
                                  int bank_hi_shift, MaskedAddress addr,
                                  u8 value) {
  Mbc1* mbc1 = &MMAP_STATE.mbc1;
  switch (addr >> 13) {
    case 0: /* 0000-1fff */
      MMAP_STATE.ext_ram_enabled =
          (value & MBC_RAM_ENABLED_MASK) == MBC_RAM_ENABLED_VALUE;
      break;
    case 1: /* 2000-3fff */
      mbc1->byte_2000_3fff = value & MBC1_ROM_BANK_LO_SELECT_MASK;
      break;
    case 2: /* 4000-5fff */
      mbc1->byte_4000_5fff = value & MBC1_BANK_HI_SELECT_MASK;
      break;
    case 3: /* 6000-7fff */
      mbc1->bank_mode = (BankMode)(value & 1);
      break;
  }

  u16 hi_bank = mbc1->byte_4000_5fff << bank_hi_shift;

  u16 rom1_bank = mbc1->byte_2000_3fff;
  if (rom1_bank == 0) {
    rom1_bank++;
  }
  rom1_bank = (rom1_bank & bank_lo_mask) | hi_bank;

  u16 rom0_bank = 0;
  u8 ext_ram_bank = 0;
  if (mbc1->bank_mode == BANK_MODE_RAM) {
    rom0_bank |= hi_bank;
    ext_ram_bank = mbc1->byte_4000_5fff;
  }

  set_rom_bank(e, 0, rom0_bank);
  set_rom_bank(e, 1, rom1_bank);
  set_ext_ram_bank(e, ext_ram_bank);
}